

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O2

void __thiscall KMeans::modelToQueries(KMeans *this)

{
  _WordT _Var1;
  Aggregate *pAVar2;
  Query *pQVar3;
  vector<std::pair<unsigned_long,Query*>,std::allocator<std::pair<unsigned_long,Query*>>> *this_00;
  size_t var;
  ulong __position;
  Aggregate *agg_1;
  Aggregate *agg;
  bitset<1500UL> local_f0;
  
  pAVar2 = (Aggregate *)operator_new(0x30);
  (pAVar2->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pAVar2->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pAVar2->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pAVar2->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pAVar2->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pAVar2->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  agg = pAVar2;
  memset(&local_f0,0,0xc0);
  std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
  emplace_back<std::bitset<1500ul>>
            ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pAVar2,&local_f0);
  pQVar3 = (Query *)operator_new(0x30);
  (pQVar3->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
  (pQVar3->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
  (pQVar3->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pQVar3->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pQVar3->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back(&pQVar3->_aggregates,&agg);
  pQVar3->_rootID =
       ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_root
       ->_id;
  _Var1 = (this->clusterVariables).super__Base_bitset<2UL>._M_w[1];
  (pQVar3->_fVars).super__Base_bitset<2UL>._M_w[0] =
       (this->clusterVariables).super__Base_bitset<2UL>._M_w[0];
  (pQVar3->_fVars).super__Base_bitset<2UL>._M_w[1] = _Var1;
  QueryCompiler::addQuery
            ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pQVar3);
  countQuery = pQVar3;
  for (__position = 0; __position != 100; __position = __position + 1) {
    if (((this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[__position >> 6] >>
         (__position & 0x3f) & 1) != 0) {
      pAVar2 = (Aggregate *)operator_new(0x30);
      (pAVar2->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pAVar2->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pAVar2->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pAVar2->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pAVar2->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pAVar2->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      agg_1 = pAVar2;
      memset((pair<unsigned_long,_Query_*> *)&local_f0,0,0xc0);
      std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
      emplace_back<std::bitset<1500ul>>
                ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pAVar2,&local_f0
                );
      pQVar3 = (Query *)operator_new(0x30);
      (pQVar3->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
      (pQVar3->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
      (pQVar3->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pQVar3->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pQVar3->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back(&pQVar3->_aggregates,&agg_1)
      ;
      pQVar3->_rootID = this->_queryRootIndex[__position];
      std::bitset<100UL>::set(&pQVar3->_fVars,__position,true);
      QueryCompiler::addQuery
                ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,pQVar3);
      this_00 = (vector<std::pair<unsigned_long,Query*>,std::allocator<std::pair<unsigned_long,Query*>>>
                 *)&this->continuousQueries;
      if (((this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w
           [__position >> 6] & 1L << ((byte)__position & 0x3f)) != 0) {
        this_00 = (vector<std::pair<unsigned_long,Query*>,std::allocator<std::pair<unsigned_long,Query*>>>
                   *)&this->categoricalQueries;
      }
      local_f0.super__Base_bitset<24UL>._M_w[0] = __position;
      local_f0.super__Base_bitset<24UL>._M_w[1] = (_WordT)pQVar3;
      std::vector<std::pair<unsigned_long,Query*>,std::allocator<std::pair<unsigned_long,Query*>>>::
      emplace_back<std::pair<unsigned_long,Query*>>
                (this_00,(pair<unsigned_long,_Query_*> *)&local_f0);
      this->varToQuery[__position] = pQVar3;
    }
  }
  return;
}

Assistant:

void KMeans::modelToQueries()
{
    // Count aggregate
    Aggregate* agg = new Aggregate();
    agg->_agg.push_back(prod_bitset());

    // Create count query
    Query* query = new Query();
    query->_aggregates.push_back(agg);
    query->_rootID = _td->_root->_id;
    query->_fVars = clusterVariables;

    _compiler->addQuery(query);        
    countQuery = query;

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var) 
    {
        if (!_isFeature[var])
            continue;

        // Categorical variable
        Aggregate* agg = new Aggregate();
        agg->_agg.push_back(prod_bitset());

        // Create a query & Aggregate
        Query* query = new Query();
        query->_aggregates.push_back(agg);
        query->_rootID = _queryRootIndex[var];
        query->_fVars.set(var);

        _compiler->addQuery(query);
        
        if (_isCategoricalFeature[var])
        {
            // Categorical variable
            categoricalQueries.push_back({var,query});
        }
        else
        {
            // Continuous variable
            continuousQueries.push_back({var,query});
        }

        varToQuery[var] = query;
    }
}